

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ImplementsClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ImplementsClauseSyntax,slang::parsing::Token&,slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>const&>
          (BumpAllocator *this,Token *args,SeparatedSyntaxList<slang::syntax::NameSyntax> *args_1)

{
  ImplementsClauseSyntax *pIVar1;
  BumpAllocator *in_RDX;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *in_RDI;
  ImplementsClauseSyntax *unaff_retaddr;
  Token in_stack_00000008;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  pIVar1 = (ImplementsClauseSyntax *)
           allocate(in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  slang::syntax::ImplementsClauseSyntax::ImplementsClauseSyntax
            (unaff_retaddr,in_stack_00000008,in_RDI);
  return pIVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }